

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall kratos::SortInitialVisitor::visit(SortInitialVisitor *this,Generator *top)

{
  long lVar1;
  undefined1 local_50 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> new_stmts;
  undefined8 local_30;
  long local_28;
  
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,void>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             local_50,(top->stmts_).
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
             (top->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (allocator_type *)
             &new_stmts.
              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_50 !=
      (undefined1  [8])
      new_stmts.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar1 = (long)new_stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>,_std::shared_ptr<kratos::Stmt>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>,_std::shared_ptr<kratos::Stmt>_>
                         *)&new_stmts.
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                         )local_50,(lVar1 - (lVar1 + 1 >> 0x3f)) + 1 >> 1);
    if (local_28 == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SortInitialVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (local_50,new_stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,std::shared_ptr<kratos::Stmt>*,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SortInitialVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (local_50,new_stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_28,local_30);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>,_std::shared_ptr<kratos::Stmt>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>,_std::shared_ptr<kratos::Stmt>_>
                *)&new_stmts.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  operator=(&top->stmts_,
            (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)local_50);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_50);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto const& stmts = top->get_all_stmts();
        auto new_stmts = std::vector<std::shared_ptr<Stmt>>(stmts.begin(), stmts.end());

        // move initialize to the last
        std::stable_sort(
            new_stmts.begin(), new_stmts.end(),
            [](const auto& left, const auto& right) { return get_order(left) < get_order(right); });

        top->set_stmts(new_stmts);
    }